

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase222::run(TestCase222 *this)

{
  unsigned_long *puVar1;
  ArrayPtr<unsigned_char> AVar2;
  bool local_c9;
  bool _kj_shouldLog_1;
  uint64_t *i2;
  byte *local_b8;
  bool local_a9;
  uint64_t *puStack_a8;
  bool _kj_shouldLog;
  uint16_t *i;
  size_t local_98;
  ArrayPtr<unsigned_char> local_80;
  uchar *local_70;
  byte *start;
  undefined1 local_58 [8];
  Arena arena;
  byte scratch [34];
  TestCase222 *this_local;
  
  unique0x10000290 = this;
  _start = arrayPtr<unsigned_char>((uchar *)&arena.currentChunk,0x22);
  Arena::Arena((Arena *)local_58,_start);
  local_80 = Arena::allocateArray<unsigned_char>((Arena *)local_58,0);
  local_70 = ArrayPtr<unsigned_char>::begin(&local_80);
  AVar2 = Arena::allocateArray<unsigned_char>
                    ((Arena *)local_58,(size_t)(scratch + (0x10 - (long)local_70)));
  local_98 = AVar2.size_;
  i = (uint16_t *)AVar2.ptr;
  puStack_a8 = (uint64_t *)Arena::allocate<unsigned_short>((Arena *)local_58);
  if ((uint64_t *)(scratch + 0x10) != puStack_a8) {
    local_a9 = _::Debug::shouldLog(ERROR);
    while (local_a9 != false) {
      local_b8 = scratch + 0x10;
      i2 = puStack_a8;
      _::Debug::log<char_const(&)[65],unsigned_char*,unsigned_char*>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
                 ,0xee,ERROR,
                 "\"failed: expected \" \"(scratch + 24) == (reinterpret_cast<byte*>(&i))\", scratch + 24, reinterpret_cast<byte*>(&i)"
                 ,(char (*) [65])"failed: expected (scratch + 24) == (reinterpret_cast<byte*>(&i))",
                 &local_b8,(uchar **)&i2);
      local_a9 = false;
    }
  }
  puVar1 = Arena::allocate<unsigned_long>((Arena *)local_58);
  if ((&arena.currentChunk <= puVar1) && (puVar1 <= scratch + 0x1a)) {
    local_c9 = _::Debug::shouldLog(ERROR);
    while (local_c9 != false) {
      _::Debug::log<char_const(&)[116]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
                 ,0xf4,ERROR,
                 "\"failed: expected \" \"reinterpret_cast<byte*>(&i2) < scratch || reinterpret_cast<byte*>(&i2) > scratch + sizeof(scratch)\""
                 ,(char (*) [116])
                  "failed: expected reinterpret_cast<byte*>(&i2) < scratch || reinterpret_cast<byte*>(&i2) > scratch + sizeof(scratch)"
                );
      local_c9 = false;
    }
  }
  Arena::~Arena((Arena *)local_58);
  return;
}

Assistant:

TEST(Arena, EndOfChunkAlignment) {
  union {
    byte scratch[34];
    uint64_t align;
  };
  Arena arena(arrayPtr(scratch, sizeof(scratch)));

  // Figure out where we are...
  byte* start = arena.allocateArray<byte>(0).begin();

  // Allocate enough space so that we're 24 bytes into the scratch space.  (On 64-bit systems, this
  // should be zero.)
  arena.allocateArray<byte>(24 - (start - scratch));

  // Allocating a 16-bit integer works.  Now we're at 26 bytes; 8 bytes are left.
  uint16_t& i = arena.allocate<uint16_t>();
  EXPECT_EQ(scratch + 24, reinterpret_cast<byte*>(&i));

  // Although there is technically enough space to allocate a uint64, it is not aligned correctly,
  // so it will be allocated elsewhere instead.
  uint64_t& i2 = arena.allocate<uint64_t>();
  EXPECT_TRUE(reinterpret_cast<byte*>(&i2) < scratch ||
              reinterpret_cast<byte*>(&i2) > scratch + sizeof(scratch));
}